

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddApa.c
# Opt level: O2

void Cudd_ApaPowerOfTwo(int digits,DdApaNumber number,int power)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  
  uVar1 = 0;
  uVar2 = 0;
  if (0 < digits) {
    uVar2 = (ulong)(uint)digits;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    number[uVar1] = 0;
  }
  uVar3 = (digits + power / -0x20) - 1;
  if (-1 < (int)uVar3) {
    number[uVar3] = 1 << ((byte)power & 0x1f);
  }
  return;
}

Assistant:

void
Cudd_ApaPowerOfTwo(
  int  digits,
  DdApaNumber  number,
  int  power)
{
    int i;
    int index;

    for (i = 0; i < digits; i++)
        number[i] = 0;
    i = digits - 1 - power / DD_APA_BITS;
    if (i < 0) return;
    index = power & (DD_APA_BITS - 1);
    number[i] = 1 << index;

}